

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O1

int duckdb_lz4::LZ4_decompress_safe_usingDict
              (char *source,char *dest,int compressedSize,int maxOutputSize,char *dictStart,
              int dictSize)

{
  int iVar1;
  size_t dictSize_00;
  dict_directive dict;
  BYTE *lowPrefix;
  
  lowPrefix = (BYTE *)dest;
  if (dictSize != 0) {
    dictSize_00 = (size_t)dictSize;
    if (dictStart + dictSize_00 != dest) {
      dict = usingExtDict;
      goto LAB_01d359f5;
    }
    if (0xfffe < dictSize) {
      lowPrefix = (BYTE *)(dest + -0x10000);
      dictStart = (char *)0x0;
      dictSize_00 = 0;
      dict = withPrefix64k;
      goto LAB_01d359f5;
    }
    lowPrefix = (BYTE *)(dest + -dictSize_00);
  }
  dictSize_00 = 0;
  dictStart = (char *)0x0;
  dict = noDict;
LAB_01d359f5:
  iVar1 = LZ4_decompress_generic
                    (source,dest,compressedSize,maxOutputSize,decode_full_block,dict,lowPrefix,
                     (BYTE *)dictStart,dictSize_00);
  return iVar1;
}

Assistant:

int LZ4_decompress_safe_usingDict(const char* source, char* dest, int compressedSize, int maxOutputSize, const char* dictStart, int dictSize)
{
    if (dictSize==0)
        return LZ4_decompress_safe(source, dest, compressedSize, maxOutputSize);
    if (dictStart+dictSize == dest) {
        if (dictSize >= 64 KB - 1) {
            return LZ4_decompress_safe_withPrefix64k(source, dest, compressedSize, maxOutputSize);
        }
        assert(dictSize >= 0);
        return LZ4_decompress_safe_withSmallPrefix(source, dest, compressedSize, maxOutputSize, (size_t)dictSize);
    }
    assert(dictSize >= 0);
    return LZ4_decompress_safe_forceExtDict(source, dest, compressedSize, maxOutputSize, dictStart, (size_t)dictSize);
}